

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * convert_run_optimize(container_t *c,uint8_t typecode_original,uint8_t *typecode_after)

{
  ulong *puVar1;
  rle16_t *prVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  run_container_t *prVar7;
  ushort uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  long lVar12;
  int size;
  uint uVar13;
  long lVar14;
  
  iVar6 = (int)CONCAT71(in_register_00000031,typecode_original);
  prVar7 = (run_container_t *)c;
  if (iVar6 == 2) {
    iVar6 = *c;
    lVar14 = (long)iVar6;
    if (lVar14 == 0) {
      size = 0;
    }
    else {
      lVar9 = 0;
      uVar13 = 0xfffffffe;
      size = 0;
      do {
        uVar11 = uVar13 + 1;
        uVar13 = (uint)*(ushort *)(*(long *)((long)c + 8) + lVar9);
        size = size + (uint)(uVar11 != uVar13);
        lVar9 = lVar9 + 2;
      } while (lVar14 * 2 != lVar9);
    }
    if (SBORROW4(size * 4,iVar6 * 2) == size * 4 + iVar6 * -2 < 0) {
      *typecode_after = '\x02';
    }
    else {
      prVar7 = run_container_create_given_capacity(size);
      if (iVar6 < 1) {
        uVar13 = 0xfffffffe;
        uVar11 = 0xffffffff;
      }
      else {
        lVar9 = *(long *)((long)c + 8);
        uVar11 = 0xffffffff;
        uVar13 = 0xfffffffe;
        lVar12 = 0;
        do {
          uVar8 = *(ushort *)(lVar9 + lVar12 * 2);
          if (uVar13 + 1 == (uint)uVar8) {
            uVar4 = (uint)uVar8;
            uVar5 = uVar11;
          }
          else {
            uVar4 = (uint)uVar8;
            uVar5 = (uint)uVar8;
            if (uVar11 != 0xffffffff) {
              prVar2 = prVar7->runs;
              iVar6 = prVar7->n_runs;
              prVar2[iVar6].value = (uint16_t)uVar11;
              prVar2[iVar6].length = (short)uVar13 - (uint16_t)uVar11;
              prVar7->n_runs = iVar6 + 1;
              uVar4 = (uint)*(ushort *)(lVar9 + lVar12 * 2);
            }
          }
          uVar11 = uVar5;
          uVar13 = uVar4;
          lVar12 = lVar12 + 1;
        } while (lVar14 != lVar12);
      }
      prVar2 = prVar7->runs;
      iVar6 = prVar7->n_runs;
      prVar2[iVar6].value = (uint16_t)uVar11;
      prVar2[iVar6].length = (short)uVar13 - (uint16_t)uVar11;
      prVar7->n_runs = iVar6 + 1;
      *typecode_after = '\x03';
      (*global_memory_hook.free)(*(void **)((long)c + 8));
      (*global_memory_hook.free)(c);
    }
  }
  else if (iVar6 == 3) {
    prVar7 = (run_container_t *)
             convert_run_to_efficient_container((run_container_t *)c,typecode_after);
    if (prVar7 != (run_container_t *)c) {
      container_free(c,'\x03');
    }
  }
  else {
    iVar6 = bitset_container_number_of_runs((bitset_container_t *)c);
    if (iVar6 * 4 + 2 < 0x2000) {
      prVar7 = run_container_create_given_capacity(iVar6);
      puVar1 = *(ulong **)((long)c + 8);
      uVar10 = *puVar1;
      lVar14 = 0;
      do {
        if ((uVar10 == 0) && ((int)lVar14 < 0x3ff)) {
          lVar9 = (long)(int)lVar14;
          do {
            lVar14 = lVar9 + 1;
            uVar10 = puVar1[lVar9 + 1];
            if (uVar10 != 0) break;
            bVar3 = lVar9 < 0x3fe;
            lVar9 = lVar14;
          } while (bVar3);
        }
        if (uVar10 == 0) goto LAB_00111e21;
        lVar9 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        iVar6 = (int)lVar14;
        uVar8 = (ushort)(iVar6 << 6) | (ushort)lVar9;
        uVar10 = uVar10 - 1 | uVar10;
        if ((uVar10 == 0xffffffffffffffff) && (iVar6 < 0x3ff)) {
          lVar9 = (long)iVar6;
          do {
            lVar14 = lVar9 + 1;
            uVar10 = puVar1[lVar9 + 1];
            if (uVar10 != 0xffffffffffffffff) break;
            bVar3 = lVar9 < 0x3fe;
            lVar9 = lVar14;
          } while (bVar3);
        }
        if (uVar10 == 0xffffffffffffffff) {
          prVar2 = prVar7->runs;
          iVar6 = prVar7->n_runs;
          prVar2[iVar6].value = uVar8;
          prVar2[iVar6].length = ((short)lVar14 * 0x40 - uVar8) + 0x3f;
          prVar7->n_runs = iVar6 + 1;
LAB_00111e21:
          if (c != (container_t *)0x0) {
            (*global_memory_hook.aligned_free)(puVar1);
            (*global_memory_hook.free)(c);
          }
          *typecode_after = '\x03';
          return prVar7;
        }
        lVar9 = 0;
        if (~uVar10 != 0) {
          for (; (~uVar10 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        prVar2 = prVar7->runs;
        iVar6 = prVar7->n_runs;
        prVar2[iVar6].value = uVar8;
        prVar2[iVar6].length = ~uVar8 + (short)((int)lVar14 << 6) + (short)lVar9;
        prVar7->n_runs = iVar6 + 1;
        uVar10 = uVar10 + 1 & uVar10;
      } while( true );
    }
    *typecode_after = '\x01';
  }
  return prVar7;
}

Assistant:

container_t *convert_run_optimize(container_t *c, uint8_t typecode_original,
                                  uint8_t *typecode_after) {
    if (typecode_original == RUN_CONTAINER_TYPE) {
        container_t *newc =
            convert_run_to_efficient_container(CAST_run(c), typecode_after);
        if (newc != c) {
            container_free(c, typecode_original);
        }
        return newc;
    } else if (typecode_original == ARRAY_CONTAINER_TYPE) {
        // it might need to be converted to a run container.
        array_container_t *c_qua_array = CAST_array(c);
        int32_t n_runs = array_container_number_of_runs(c_qua_array);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t card = array_container_cardinality(c_qua_array);
        int32_t size_as_array_container =
            array_container_serialized_size_in_bytes(card);

        if (size_as_run_container >= size_as_array_container) {
            *typecode_after = ARRAY_CONTAINER_TYPE;
            return c;
        }
        // else convert array to run container
        run_container_t *answer = run_container_create_given_capacity(n_runs);
        int prev = -2;
        int run_start = -1;

        assert(card > 0);
        for (int i = 0; i < card; ++i) {
            uint16_t cur_val = c_qua_array->array[i];
            if (cur_val != prev + 1) {
                // new run starts; flush old one, if any
                if (run_start != -1) add_run(answer, run_start, prev);
                run_start = cur_val;
            }
            prev = c_qua_array->array[i];
        }
        assert(run_start >= 0);
        // now prev is the last seen value
        add_run(answer, run_start, prev);
        *typecode_after = RUN_CONTAINER_TYPE;
        array_container_free(c_qua_array);
        return answer;
    } else if (typecode_original ==
               BITSET_CONTAINER_TYPE) {  // run conversions on bitset
        // does bitset need conversion to run?
        bitset_container_t *c_qua_bitset = CAST_bitset(c);
        int32_t n_runs = bitset_container_number_of_runs(c_qua_bitset);
        int32_t size_as_run_container =
            run_container_serialized_size_in_bytes(n_runs);
        int32_t size_as_bitset_container =
            bitset_container_serialized_size_in_bytes();

        if (size_as_bitset_container <= size_as_run_container) {
            // no conversion needed.
            *typecode_after = BITSET_CONTAINER_TYPE;
            return c;
        }
        // bitset to runcontainer (ported from Java  RunContainer(
        // BitmapContainer bc, int nbrRuns))
        assert(n_runs > 0);  // no empty bitmaps
        run_container_t *answer = run_container_create_given_capacity(n_runs);

        int long_ctr = 0;
        uint64_t cur_word = c_qua_bitset->words[0];
        while (true) {
            while (cur_word == UINT64_C(0) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word = c_qua_bitset->words[++long_ctr];

            if (cur_word == UINT64_C(0)) {
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }

            int local_run_start = roaring_trailing_zeroes(cur_word);
            int run_start = local_run_start + 64 * long_ctr;
            uint64_t cur_word_with_1s = cur_word | (cur_word - 1);

            int run_end = 0;
            while (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF) &&
                   long_ctr < BITSET_CONTAINER_SIZE_IN_WORDS - 1)
                cur_word_with_1s = c_qua_bitset->words[++long_ctr];

            if (cur_word_with_1s == UINT64_C(0xFFFFFFFFFFFFFFFF)) {
                run_end = 64 + long_ctr * 64;  // exclusive, I guess
                add_run(answer, run_start, run_end - 1);
                bitset_container_free(c_qua_bitset);
                *typecode_after = RUN_CONTAINER_TYPE;
                return answer;
            }
            int local_run_end = roaring_trailing_zeroes(~cur_word_with_1s);
            run_end = local_run_end + long_ctr * 64;
            add_run(answer, run_start, run_end - 1);
            cur_word = cur_word_with_1s & (cur_word_with_1s + 1);
        }
        return answer;
    } else {
        assert(false);
        roaring_unreachable;
        return NULL;
    }
}